

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

MockSpec<bool_(long_*)> * __thiscall
testing::internal::FunctionMocker<bool_(long_*)>::With
          (MockSpec<bool_(long_*)> *__return_storage_ptr__,FunctionMocker<bool_(long_*)> *this,
          Matcher<long_*> *m)

{
  MatcherBase<long_*> local_20;
  
  local_20.vtable_ = (m->super_MatcherBase<long_*>).vtable_;
  local_20.buffer_ = (m->super_MatcherBase<long_*>).buffer_;
  (m->super_MatcherBase<long_*>).vtable_ = (VTable *)0x0;
  local_20.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00186d08;
  __return_storage_ptr__->function_mocker_ = this;
  Matcher<long_*>::Matcher
            ((Matcher<long_*> *)&__return_storage_ptr__->matchers_,(Matcher<long_*> *)&local_20);
  MatcherBase<long_*>::~MatcherBase(&local_20);
  return __return_storage_ptr__;
}

Assistant:

MockSpec<F> With(Matcher<Args>... m) {
    return MockSpec<F>(this, ::std::make_tuple(std::move(m)...));
  }